

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.cpp
# Opt level: O0

void __thiscall gui::Container::addWidgetUnderMouse(Container *this,Vector2f *mouseParent)

{
  Widget *pWVar1;
  Vector2f *in_RDI;
  Vector2f this_00;
  Widget *unaff_retaddr;
  Widget *widget;
  Vector2f mouseLocal;
  Widget *in_stack_ffffffffffffffc8;
  Vector2f *in_stack_ffffffffffffffe0;
  
  Widget::addWidgetUnderMouse(unaff_retaddr,in_RDI);
  this_00 = Widget::toLocalSpace(in_stack_ffffffffffffffc8,(Vector2f *)0x29132a);
  pWVar1 = ContainerBase::getWidgetUnderMouse((ContainerBase *)this_00,in_stack_ffffffffffffffe0);
  if (pWVar1 != (Widget *)0x0) {
    (*(pWVar1->super_Drawable)._vptr_Drawable[0x11])(pWVar1,&stack0xffffffffffffffe8);
  }
  return;
}

Assistant:

void Container::addWidgetUnderMouse(const sf::Vector2f& mouseParent) {
    Widget::addWidgetUnderMouse(mouseParent);
    auto mouseLocal = toLocalSpace(mouseParent);
    auto widget = getWidgetUnderMouse(mouseLocal);
    if (widget != nullptr) {
        widget->addWidgetUnderMouse(mouseLocal);
    }
}